

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O0

void opn2_setChannelAllocMode(OPN2_MIDIPlayer *device,int chanalloc)

{
  OPN2 *pOVar1;
  Synth *synth;
  MidiPlayer *play;
  int chanalloc_local;
  OPN2_MIDIPlayer *device_local;
  
  if (device != (OPN2_MIDIPlayer *)0x0) {
    if (device->opn2_midiPlayer == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x1f1,"void opn2_setChannelAllocMode(struct OPN2_MIDIPlayer *, int)");
    }
    pOVar1 = AdlMIDI_UPtr<OPN2,_ADLMIDI_DefaultDelete<OPN2>_>::operator*
                       ((AdlMIDI_UPtr<OPN2,_ADLMIDI_DefaultDelete<OPN2>_> *)
                        ((long)device->opn2_midiPlayer + 400));
    if ((chanalloc < -1) || (play._4_4_ = chanalloc, 2 < chanalloc)) {
      play._4_4_ = OPNMIDI_ChanAlloc_AUTO;
    }
    pOVar1->m_channelAlloc = play._4_4_;
  }
  return;
}

Assistant:

OPNMIDI_EXPORT void opn2_setChannelAllocMode(struct OPN2_MIDIPlayer *device, int chanalloc)
{
    if(!device)
        return;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth &synth = *play->m_synth;
    if(chanalloc < -1 || chanalloc >= OPNMIDI_ChanAlloc_Count)
        chanalloc = OPNMIDI_ChanAlloc_AUTO;
    synth.m_channelAlloc = static_cast<OPNMIDI_ChannelAlloc>(chanalloc);
}